

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH3_state_t * VELOCYPACK_XXH3_createState(void)

{
  long lVar1;
  void *pvVar2;
  XXH3_state_t *pXVar3;
  ulong uVar4;
  long lVar5;
  
  pvVar2 = malloc(0x280);
  if (pvVar2 == (void *)0x0) {
    pXVar3 = (XXH3_state_t *)0x0;
  }
  else {
    uVar4 = (ulong)((uint)pvVar2 & 0x3f);
    lVar1 = -uVar4;
    lVar5 = lVar1 + 0x40;
    pXVar3 = (XXH3_state_t *)((long)pvVar2 + lVar5);
    *(char *)((long)pvVar2 + (0x3f - uVar4)) = (char)lVar5;
    *(undefined8 *)((long)pvVar2 + lVar1 + 0x268) = 0;
  }
  return pXVar3;
}

Assistant:

XXH_PUBLIC_API XXH3_state_t* XXH3_createState(void) {
  XXH3_state_t* const state =
      (XXH3_state_t*)XXH_alignedMalloc(sizeof(XXH3_state_t), 64);
  if (state == NULL) return NULL;
  XXH3_INITSTATE(state);
  return state;
}